

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O2

drwav_uint64
drwav_read_pcm_frames_s32(drwav *pWav,drwav_uint64 framesToRead,drwav_int32 *pBufferOut)

{
  drwav_uint32 dVar1;
  uint uVar2;
  drwav_uint64 dVar3;
  ulong uVar4;
  uint shift;
  int iVar5;
  size_t sampleCount;
  ulong uVar6;
  uint j;
  long lVar7;
  drwav_int16 *pdVar8;
  ulong sampleCount_00;
  drwav_int32 *pdVar9;
  ulong uVar10;
  ulong uVar11;
  drwav_uint64 totalFramesRead;
  drwav_uint64 dVar12;
  bool bVar13;
  drwav_int16 samples16 [2048];
  
  if (framesToRead == 0 || pWav == (drwav *)0x0) goto LAB_0010798c;
  if (pBufferOut == (drwav_int32 *)0x0) {
    dVar12 = drwav_read_pcm_frames_le(pWav,framesToRead,(void *)0x0);
    return dVar12;
  }
  dVar12 = 0;
  switch(pWav->translatedFormatTag) {
  case 1:
    if (pWav->bitsPerSample == 0x20) {
      dVar12 = drwav_read_pcm_frames_le(pWav,framesToRead,pBufferOut);
      return dVar12;
    }
    dVar1 = drwav_get_bytes_per_pcm_frame(pWav);
    if (dVar1 != 0) {
      dVar12 = 0;
      while( true ) {
        if (framesToRead == 0) {
          return dVar12;
        }
        uVar4 = 0x1000 / (ulong)dVar1;
        if (framesToRead < uVar4) {
          uVar4 = framesToRead;
        }
        dVar3 = drwav_read_pcm_frames_le(pWav,uVar4,samples16);
        if (dVar3 == 0) break;
        sampleCount_00 = dVar3 * pWav->channels;
        uVar4 = (ulong)dVar1 / (ulong)pWav->channels;
        uVar2 = (uint)uVar4;
        switch(uVar2) {
        case 1:
          drwav_u8_to_s32(pBufferOut,(drwav_uint8 *)samples16,sampleCount_00);
          break;
        case 2:
          drwav_s16_to_s32(pBufferOut,samples16,sampleCount_00);
          break;
        case 3:
          drwav_s24_to_s32(pBufferOut,(drwav_uint8 *)samples16,sampleCount_00);
          break;
        case 4:
          for (uVar4 = 0; uVar6 = uVar4 & 0xffffffff,
              uVar6 <= sampleCount_00 && sampleCount_00 - uVar6 != 0; uVar4 = uVar4 + 1) {
            pBufferOut[uVar4] = *(drwav_int32 *)(samples16 + uVar6 * 2);
          }
          break;
        default:
          if (uVar2 < 9) {
            pdVar8 = samples16;
            pdVar9 = pBufferOut;
            for (uVar6 = 0; uVar6 <= sampleCount_00 && sampleCount_00 - uVar6 != 0;
                uVar6 = (ulong)((int)uVar6 + 1)) {
              lVar7 = 0;
              uVar10 = 0;
              uVar11 = uVar4;
              iVar5 = uVar2 * -8 + 0x40;
              while (bVar13 = uVar11 != 0, uVar11 = uVar11 - 1, bVar13) {
                uVar10 = uVar10 | (ulong)*(byte *)((long)pdVar8 + lVar7) << ((byte)iVar5 & 0x3f);
                iVar5 = iVar5 + 8;
                lVar7 = lVar7 + 1;
              }
              pdVar8 = (drwav_int16 *)((long)pdVar8 + uVar4);
              *pdVar9 = (drwav_int32)(uVar10 >> 0x20);
              pdVar9 = pdVar9 + 1;
            }
          }
          else {
            memset(pBufferOut,0,sampleCount_00 * 4);
          }
        }
        pBufferOut = pBufferOut + pWav->channels * dVar3;
        framesToRead = framesToRead - dVar3;
        dVar12 = dVar12 + dVar3;
      }
      return dVar12;
    }
    goto LAB_0010798c;
  case 2:
    dVar12 = 0;
    for (; framesToRead != 0; framesToRead = framesToRead - dVar3) {
      uVar4 = (ulong)(0x800 / pWav->channels);
      if (framesToRead < uVar4) {
        uVar4 = framesToRead;
      }
      dVar3 = drwav_read_pcm_frames_s16(pWav,uVar4,samples16);
      if (dVar3 == 0) {
        return dVar12;
      }
      drwav_s16_to_s32(pBufferOut,samples16,pWav->channels * dVar3);
      pBufferOut = pBufferOut + pWav->channels * dVar3;
      dVar12 = dVar12 + dVar3;
    }
    break;
  case 3:
    dVar1 = drwav_get_bytes_per_pcm_frame(pWav);
    if (dVar1 != 0) {
      dVar12 = 0;
      while( true ) {
        if (framesToRead == 0) {
          return dVar12;
        }
        uVar4 = 0x1000 / (ulong)dVar1;
        if (framesToRead < 0x1000 / (ulong)dVar1) {
          uVar4 = framesToRead;
        }
        dVar3 = drwav_read_pcm_frames_le(pWav,uVar4,samples16);
        if (dVar3 == 0) break;
        sampleCount = dVar3 * pWav->channels;
        uVar2 = dVar1 / pWav->channels;
        if (uVar2 == 8) {
          drwav_f64_to_s32(pBufferOut,(double *)samples16,sampleCount);
        }
        else if (uVar2 == 4) {
          drwav_f32_to_s32(pBufferOut,(float *)samples16,sampleCount);
        }
        else {
          memset(pBufferOut,0,sampleCount * 4);
        }
        pBufferOut = pBufferOut + pWav->channels * dVar3;
        framesToRead = framesToRead - dVar3;
        dVar12 = dVar12 + dVar3;
      }
      return dVar12;
    }
LAB_0010798c:
    dVar12 = 0;
    break;
  case 4:
  case 5:
    break;
  case 6:
    dVar1 = drwav_get_bytes_per_pcm_frame(pWav);
    dVar3 = 0;
    dVar12 = 0;
    if (dVar1 != 0) {
      for (; dVar12 = dVar3, framesToRead != 0; framesToRead = framesToRead - dVar12) {
        uVar4 = 0x1000 / (ulong)dVar1;
        if (framesToRead < 0x1000 / (ulong)dVar1) {
          uVar4 = framesToRead;
        }
        dVar12 = drwav_read_pcm_frames_le(pWav,uVar4,samples16);
        if (dVar12 == 0) {
          return dVar3;
        }
        drwav_alaw_to_s32(pBufferOut,(drwav_uint8 *)samples16,pWav->channels * dVar12);
        pBufferOut = pBufferOut + pWav->channels * dVar12;
        dVar3 = dVar3 + dVar12;
      }
    }
    break;
  case 7:
    dVar1 = drwav_get_bytes_per_pcm_frame(pWav);
    dVar12 = 0;
    if (dVar1 != 0) {
      for (; framesToRead != 0; framesToRead = framesToRead - dVar3) {
        uVar4 = 0x1000 / (ulong)dVar1;
        if (framesToRead < 0x1000 / (ulong)dVar1) {
          uVar4 = framesToRead;
        }
        dVar3 = drwav_read_pcm_frames_le(pWav,uVar4,samples16);
        if (dVar3 == 0) {
          return dVar12;
        }
        drwav_mulaw_to_s32(pBufferOut,(drwav_uint8 *)samples16,pWav->channels * dVar3);
        pBufferOut = pBufferOut + pWav->channels * dVar3;
        dVar12 = dVar12 + dVar3;
      }
    }
    break;
  default:
    if (pWav->translatedFormatTag == 0x11) {
      dVar12 = 0;
      for (; framesToRead != 0; framesToRead = framesToRead - dVar3) {
        uVar4 = (ulong)(0x800 / pWav->channels);
        if (framesToRead < uVar4) {
          uVar4 = framesToRead;
        }
        dVar3 = drwav_read_pcm_frames_s16(pWav,uVar4,samples16);
        if (dVar3 == 0) {
          return dVar12;
        }
        drwav_s16_to_s32(pBufferOut,samples16,pWav->channels * dVar3);
        pBufferOut = pBufferOut + pWav->channels * dVar3;
        dVar12 = dVar12 + dVar3;
      }
    }
  }
  return dVar12;
}

Assistant:

DRWAV_API drwav_uint64 drwav_read_pcm_frames_s32(drwav* pWav, drwav_uint64 framesToRead, drwav_int32* pBufferOut)
{
    if (pWav == NULL || framesToRead == 0) {
        return 0;
    }

    if (pBufferOut == NULL) {
        return drwav_read_pcm_frames(pWav, framesToRead, NULL);
    }

    /* Don't try to read more samples than can potentially fit in the output buffer. */
    if (framesToRead * pWav->channels * sizeof(drwav_int32) > DRWAV_SIZE_MAX) {
        framesToRead = DRWAV_SIZE_MAX / sizeof(drwav_int32) / pWav->channels;
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_PCM) {
        return drwav_read_pcm_frames_s32__pcm(pWav, framesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_ADPCM) {
        return drwav_read_pcm_frames_s32__msadpcm(pWav, framesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_IEEE_FLOAT) {
        return drwav_read_pcm_frames_s32__ieee(pWav, framesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_ALAW) {
        return drwav_read_pcm_frames_s32__alaw(pWav, framesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_MULAW) {
        return drwav_read_pcm_frames_s32__mulaw(pWav, framesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_DVI_ADPCM) {
        return drwav_read_pcm_frames_s32__ima(pWav, framesToRead, pBufferOut);
    }

    return 0;
}